

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O1

void __thiscall
ApprovalTests::Windows::WindowsDiffReporter::WindowsDiffReporter(WindowsDiffReporter *this)

{
  TortoiseDiffReporter *this_00;
  TortoiseGitDiffReporter *this_01;
  BeyondCompareReporter *this_02;
  WinMergeReporter *this_03;
  AraxisMergeReporter *this_04;
  CodeCompareReporter *this_05;
  SublimeMergeReporter *this_06;
  KDiff3Reporter *this_07;
  VisualStudioCodeReporter *this_08;
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type local_71;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> local_70;
  TortoiseDiffReporter *local_58;
  TortoiseGitDiffReporter *local_50;
  BeyondCompareReporter *local_48;
  WinMergeReporter *local_40;
  AraxisMergeReporter *local_38;
  CodeCompareReporter *local_30;
  SublimeMergeReporter *local_28;
  KDiff3Reporter *local_20;
  VisualStudioCodeReporter *local_18;
  
  this_00 = (TortoiseDiffReporter *)operator_new(0x20);
  TortoiseDiffReporter::TortoiseDiffReporter(this_00);
  local_58 = this_00;
  this_01 = (TortoiseGitDiffReporter *)operator_new(0x20);
  TortoiseGitDiffReporter::TortoiseGitDiffReporter(this_01);
  local_50 = this_01;
  this_02 = (BeyondCompareReporter *)operator_new(0x20);
  BeyondCompareReporter::BeyondCompareReporter(this_02);
  local_48 = this_02;
  this_03 = (WinMergeReporter *)operator_new(0x70);
  WinMergeReporter::WinMergeReporter(this_03);
  local_40 = this_03;
  this_04 = (AraxisMergeReporter *)operator_new(0x70);
  AraxisMergeReporter::AraxisMergeReporter(this_04);
  local_38 = this_04;
  this_05 = (CodeCompareReporter *)operator_new(0x70);
  CodeCompareReporter::CodeCompareReporter(this_05);
  local_30 = this_05;
  this_06 = (SublimeMergeReporter *)operator_new(0x70);
  SublimeMergeReporter::SublimeMergeReporter(this_06);
  local_28 = this_06;
  this_07 = (KDiff3Reporter *)operator_new(0x70);
  KDiff3Reporter::KDiff3Reporter(this_07);
  local_20 = this_07;
  this_08 = (VisualStudioCodeReporter *)operator_new(0x70);
  VisualStudioCodeReporter::VisualStudioCodeReporter(this_08);
  __l._M_len = 9;
  __l._M_array = (iterator)&local_58;
  local_18 = this_08;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (&local_70,__l,&local_71);
  FirstWorkingReporter::FirstWorkingReporter(&this->super_FirstWorkingReporter,&local_70);
  if (local_70.
      super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_FirstWorkingReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__FirstWorkingReporter_001af4e0;
  return;
}

Assistant:

WindowsDiffReporter::WindowsDiffReporter()
            : FirstWorkingReporter({
                  // begin-snippet: windows_diff_reporters
                  new TortoiseDiffReporter(), // Note that this uses Tortoise SVN Diff
                  new TortoiseGitDiffReporter(),
                  new BeyondCompareReporter(),
                  new WinMergeReporter(),
                  new AraxisMergeReporter(),
                  new CodeCompareReporter(),
                  new SublimeMergeReporter(),
                  new KDiff3Reporter(),
                  new VisualStudioCodeReporter(),
                  // end-snippet
              })
        {
        }